

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::BasicUsageFS::Run(BasicUsageFS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  undefined8 *puVar3;
  GLuint *ebo;
  long lVar4;
  UVec4 *pUVar5;
  UVec4 *pixels;
  GLint p2;
  GLint p1;
  GLenum draw_buffers [2];
  string local_448;
  UVec4 data [64];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d0,&p1);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d6,&p2);
  if ((p1 < 1) || (p2 < 2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,
               "GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS or GL_MAX_FRAGMENT_ATOMIC_COUNTERS are less than required"
               ,(allocator<char> *)data);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    lVar4 = 0x10;
  }
  else {
    GVar2 = glcts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 310 es\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                       ,
                       "#version 310 es\nlayout(location = 0) out uvec4 o_color[2];\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));\n}"
                       ,true);
    this->prog_ = GVar2;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->counter_buffer_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,8,(void *)0x0,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glGenTextures(this_00,2,this->rt_);
    for (lVar4 = 0xf; lVar4 != 0x11; lVar4 = lVar4 + 1) {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->rt_[lVar4 + -0xf]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    }
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->fbo_);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo_);
    lVar4 = 0;
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,this->rt_[0],0);
    ebo = (GLuint *)0xde1;
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce1,0xde1,this->rt_[1],0);
    draw_buffers[0] = 0x8ce0;
    draw_buffers[1] = 0x8ce1;
    glu::CallLogWrapper::glDrawBuffers(this_00,2,draw_buffers);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
    glcts::anon_unknown_0::SACSubcaseBase::CreateQuad
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
    puVar3 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,8,10);
    *puVar3 = 0x5000000000;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo_);
    glu::CallLogWrapper::glViewport(this_00,0,0,8,8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->counter_buffer_);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    do {
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)((long)data[0].m_data + lVar4));
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x400);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
    pixels = data;
    pUVar5 = pixels;
    glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d99,0x1405,pixels);
    GVar2 = (GLuint)pixels;
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x40,GVar2,(UVec4 *)0x0,(GLuint)pUVar5);
    lVar4 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce1);
      glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d99,0x1405,pixels);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        ((SACSubcaseBase *)0x40,GVar2,(UVec4 *)0x10,(GLuint)pixels);
      if (bVar1) {
        bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,0,0x40);
        if (bVar1) {
          bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_,4,0x10);
          lVar4 = (ulong)bVar1 - 1;
        }
      }
    }
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2;
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &p2);
		if (p1 < 1 || p2 < 2)
		{
			OutputNotSupported(
				"GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS or GL_MAX_FRAGMENT_ATOMIC_COUNTERS are less than required");
			return NOT_SUPPORTED;
		}

		// create program
		const char* src_vs = "#version 310 es" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							 "  gl_Position = i_vertex;" NL "}";

		const char* src_fs = "#version 310 es" NL "layout(location = 0) out uvec4 o_color[2];" NL
							 "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;" NL
							 "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;" NL "void main() {" NL
							 "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));" NL
							 "  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));" NL "}";
		prog_ = CreateProgram(src_vs, src_fs, true);

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(2, rt_);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, rt_[0], 0);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_TEXTURE_2D, rt_[1], 0);
		const GLenum draw_buffers[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
		glDrawBuffers(2, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateQuad(&vao_, &vbo_, NULL);

		// init counter buffer
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr++ = 0;
		*ptr++ = 80;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		// draw
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		// validate
		UVec4 data[s * s];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 0))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 16))
			return ERROR;

		if (!CheckFinalCounterValue(counter_buffer_, 0, 64))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 4, 16))
			return ERROR;

		return NO_ERROR;
	}